

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::UnaryExpression::propagateType
          (UnaryExpression *this,ASTContext *context,Type *newType,SourceRange propRange,
          ConversionKind param_4)

{
  UnaryOperator UVar1;
  SourceRange opRange;
  undefined1 in_stack_ffffffffffffffec [12];
  
  UVar1 = this->op;
  if (UVar1 < BitwiseAnd) {
    (this->super_Expression).type.ptr = newType;
    opRange._4_12_ = in_stack_ffffffffffffffec;
    opRange.startLoc._0_4_ = 1;
    Expression::contextDetermined
              ((Expression *)context,(ASTContext *)&this->operand_,(Expression **)this,
               (Expression *)newType,(Type *)propRange.startLoc,opRange,propRange.endLoc._0_4_);
  }
  return UVar1 < BitwiseAnd;
}

Assistant:

bool UnaryExpression::propagateType(const ASTContext& context, const Type& newType,
                                    SourceRange propRange, ConversionKind) {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            type = &newType;
            contextDetermined(context, operand_, this, newType, propRange);
            return true;
        case UnaryOperator::BitwiseAnd:
        case UnaryOperator::BitwiseOr:
        case UnaryOperator::BitwiseXor:
        case UnaryOperator::BitwiseNand:
        case UnaryOperator::BitwiseNor:
        case UnaryOperator::BitwiseXnor:
        case UnaryOperator::LogicalNot:
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            // Operand is self determined and already folded.
            return false;
    }
    SLANG_UNREACHABLE;
}